

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *
__thiscall
hrgls::API::GetAvailableDataBlobSources
          (vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
           *__return_storage_ptr__,API *this)

{
  API_private *pAVar1;
  char *pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  DataBlobSourceDescription ri;
  char *local_60;
  char *name;
  undefined8 local_50;
  hrgls_APIDataBlobSourceInfo info;
  id iStack_40;
  uint32_t i;
  uint local_24 [2];
  uint32_t count;
  API *local_18;
  API *this_local;
  vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *ret;
  
  count._3_1_ = 0;
  local_18 = this;
  this_local = (API *)__return_storage_ptr__;
  std::vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>::
  vector(__return_storage_ptr__);
  if (this->m_private != (API_private *)0x0) {
    iVar3 = hrgls_APIGetAvailableDataBlobSourceCount(this->m_private->m_api,local_24);
    pAVar1 = this->m_private;
    iStack_40 = std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&stack0xffffffffffffffc0);
    *pmVar4 = iVar3;
    if (iVar3 == 0) {
      for (info._4_4_ = 0; info._4_4_ < local_24[0]; info._4_4_ = info._4_4_ + 1) {
        iVar3 = hrgls_APIGetAvailableDataBlobSourceInfo(this->m_private->m_api,info._4_4_,&local_50)
        ;
        pAVar1 = this->m_private;
        name = (char *)std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar1->m_status,(key_type *)&name);
        *pmVar4 = iVar3;
        if (iVar3 != 0) {
          std::
          vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
          ::clear(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        iVar3 = hrgls_APIDataBlobSourceGetName(local_50,&local_60);
        pAVar1 = this->m_private;
        ri._24_8_ = std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar1->m_status,(key_type *)&ri.field_0x18);
        *pmVar4 = iVar3;
        if (iVar3 != 0) {
          std::
          vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
          ::clear(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        DataBlobSourceDescription::DataBlobSourceDescription((DataBlobSourceDescription *)local_88);
        pcVar2 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,pcVar2,&local_a9);
        DataBlobSourceDescription::Name((DataBlobSourceDescription *)local_88,(string *)local_a8);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::
        vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_88);
        DataBlobSourceDescription::~DataBlobSourceDescription((DataBlobSourceDescription *)local_88)
        ;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

::std::vector<DataBlobSourceDescription> API::GetAvailableDataBlobSources() const
  {
    ::std::vector<DataBlobSourceDescription> ret;
    if (!m_private) {
      return ret;
    }

    // Find out how many DataBlobSources are in the system, which will also latch the data.
    uint32_t count;
    if (hrgls_STATUS_OKAY !=
      (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceCount(m_private->m_api, &count))) {
      return ret;
    }

    // Read each DataBlobSource's information and fill it into information to be returned.
    for (uint32_t i = 0; i < count; i++) {
      hrgls_APIDataBlobSourceInfo info;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceInfo(m_private->m_api,
          i, &info))) {
        ret.clear();
        return ret;
      }

      // Get and fill in the name.
      const char *name;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIDataBlobSourceGetName(info, &name))) {
        ret.clear();
        return ret;
      }

      DataBlobSourceDescription ri;
      ri.Name(name);

      ret.push_back(ri);
    }

    return ret;
  }